

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O2

void anova(reg_object obj)

{
  putchar(10);
  puts("ANOVA : ");
  printf("%-25s%-20s%-20s%-20s \n","Source of Variation","df","SS","MSS");
  printf("%-25s%-20d%-20lf%-20lf \n",obj->ESS,obj->ESS / (double)obj->df_ESS,"Due to Regression");
  printf("%-25s%-20d%-20lf%-20lf \n",obj->RSS,obj->RSS / (double)obj->df_RSS,"Due to Residual");
  printf("%-25s%-20d%-20lf \n",obj->TSS,"Total",(ulong)(uint)(obj->df_ESS + obj->df_RSS));
  printf("\n F Statistics = %g \n",obj->FStat);
  printf("\n P Value (F)  = %g \n",obj->PVal);
  return;
}

Assistant:

void anova(reg_object obj) {
	printf("\n");
	printf("ANOVA : \n");
	printf("%-25s%-20s%-20s%-20s \n", "Source of Variation", "df", "SS", "MSS");
	printf("%-25s%-20d%-20lf%-20lf \n", "Due to Regression",
		obj->df_ESS, obj->ESS, obj->ESS / ((double)obj->df_ESS));
	printf("%-25s%-20d%-20lf%-20lf \n", "Due to Residual",
		obj->df_RSS, obj->RSS, obj->RSS / ((double)obj->df_RSS));
	printf("%-25s%-20d%-20lf \n", "Total",
		obj->df_RSS + obj->df_ESS, obj->TSS);
	printf("\n F Statistics = %g \n", obj->FStat);
	printf("\n P Value (F)  = %g \n", obj->PVal);
}